

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::map_onto<signed_char>
          (Omega_h *this,Read<signed_char> *a_data,LOs *a2b,LO nb,char init_val,Int width)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *extraout_RDX;
  Read<signed_char> RVar3;
  Write<signed_char> local_1a0;
  Write<signed_char> local_190;
  Read<int> local_180;
  Read<signed_char> local_170;
  __cxx11 local_160 [32];
  __cxx11 local_140 [55];
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [8];
  Write<signed_char> out;
  Int width_local;
  char init_val_local;
  LO nb_local;
  LOs *a2b_local;
  Read<signed_char> *a_data_local;
  int local_60;
  int local_50;
  int local_40;
  int local_30;
  int local_20;
  int local_10;
  
  out.shared_alloc_.direct_ptr._4_4_ = width;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"",&local_109);
  Write<signed_char>::Write((Write<signed_char> *)local_e8,nb * width,init_val,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  if (((ulong)local_e8 & 1) == 0) {
    local_60 = (int)*(size_t *)local_e8;
  }
  else {
    local_60 = (int)((ulong)local_e8 >> 3);
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (int)((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (int)((ulong)(a_data->write_).shared_alloc_.alloc >> 3);
  }
  if (local_60 < local_10) {
    if (((ulong)local_e8 & 1) == 0) {
      local_50 = (int)*(size_t *)local_e8;
    }
    else {
      local_50 = (int)((ulong)local_e8 >> 3);
    }
    std::__cxx11::to_string(local_140,local_50);
    uVar1 = std::__cxx11::string::c_str();
    if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
      local_20 = (int)((a_data->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_20 = (int)((ulong)(a_data->write_).shared_alloc_.alloc >> 3);
    }
    std::__cxx11::to_string(local_160,local_20);
    uVar2 = std::__cxx11::string::c_str();
    printf("ERROR: !( %s %s %s ) : ! ( %s %s %s )\n","out.size()",">=","a_data.size()",uVar1,">=",
           uVar2);
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::string::~string((string *)local_140);
  }
  if (((ulong)local_e8 & 1) == 0) {
    local_40 = (int)*(size_t *)local_e8;
  }
  else {
    local_40 = (int)((ulong)local_e8 >> 3);
  }
  if (((ulong)(a_data->write_).shared_alloc_.alloc & 1) == 0) {
    local_30 = (int)((a_data->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_30 = (int)((ulong)(a_data->write_).shared_alloc_.alloc >> 3);
  }
  if (local_30 <= local_40) {
    Read<signed_char>::Read(&local_170,a_data);
    Read<int>::Read(&local_180,a2b);
    Write<signed_char>::Write(&local_190,(Write<signed_char> *)local_e8);
    map_into<signed_char>(&local_170,&local_180,&local_190,out.shared_alloc_.direct_ptr._4_4_);
    Write<signed_char>::~Write(&local_190);
    Read<int>::~Read(&local_180);
    Read<signed_char>::~Read(&local_170);
    Write<signed_char>::Write(&local_1a0,(Write<signed_char> *)local_e8);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_1a0);
    Write<signed_char>::~Write(&local_1a0);
    Write<signed_char>::~Write((Write<signed_char> *)local_e8);
    RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
    RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar3.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","(out.size()) >= (a_data.size())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x45);
}

Assistant:

Read<T> map_onto(Read<T> a_data, LOs a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  OMEGA_H_CHECK_OP(out.size(), >=, a_data.size());
  map_into(a_data, a2b, out, width);
  return out;
}